

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

nodeid_t __thiscall EthUdpPort::InitNodes(EthUdpPort *this)

{
  quadlet_t qVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong in_RAX;
  ostream *poVar5;
  char *pcVar6;
  ulong uStack_18;
  quadlet_t data;
  
  uStack_18 = in_RAX;
  iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])
                    (this,0x3f,0xb,(ulong)(this->sockPtr->ServerAddr).sin_addr.s_addr,0x80);
  if ((char)iVar3 == '\0') {
    poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
    pcVar6 = "InitNodes: failed to write IP address";
  }
  else {
    Amp1394_Sleep(0.2);
    uStack_18 = uStack_18 & 0xffffffff;
    iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])(this,0x3f,4,&data,0xc0);
    if ((char)iVar3 == '\0') {
      poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
      pcVar6 = "InitNodes: failed to read hardware version for hub/bridge board";
    }
    else {
      bVar2 = BasePort::HardwareVersionValid(uStack_18 >> 0x20);
      if (!bVar2) {
        poVar5 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                 "InitNodes: hub board is not a supported board, data = ");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        goto LAB_00112ac8;
      }
      (this->super_EthBasePort).super_BasePort.FwBusGeneration =
           (this->super_EthBasePort).super_BasePort.newFwBusGeneration;
      poVar5 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                               "InitNodes: Firewire bus generation = ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      uStack_18 = uStack_18 & 0xffffffff;
      iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])(this,0x3f,1,0,0x80);
      if ((char)iVar3 == '\0') {
        poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
        pcVar6 = "InitNodes: failed to broadcast PHY command";
      }
      else {
        Amp1394_Sleep(0.01);
        iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                          (this,0x3f,0,&data,0xc0);
        if ((char)iVar3 == '\0') {
          poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
          pcVar6 = "InitNodes: failed to read board id for hub/bridge board";
        }
        else {
          (this->super_EthBasePort).super_BasePort.HubBoard = data._3_1_ & 0xf;
          poVar5 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                   "InitNodes: found hub board: ");
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(uint)(this->super_EthBasePort).super_BasePort.HubBoard);
          std::endl<char,std::char_traits<char>>(poVar5);
          iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                            (this,0x3f,7,&data,0xc0);
          if ((char)iVar3 == '\0') {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar6 = "InitNodes: unable to read firmware version from hub/bridge board";
          }
          else {
            qVar1 = data;
            (this->super_EthBasePort).super_BasePort.FirmwareVersion
            [(this->super_EthBasePort).super_BasePort.HubBoard] = (ulong)data;
            iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                              (this,0x3f,0xc,&data,0xc0);
            if ((char)iVar3 != '\0') {
              uVar4 = BoardIO::GetFpgaVersionMajorFromStatus(data);
              (this->super_EthBasePort).super_BasePort.FpgaVersion
              [(this->super_EthBasePort).super_BasePort.HubBoard] = uVar4;
              if ((this->super_EthBasePort).useFwBridge == false) {
                if (qVar1 < 9 || uVar4 != 3) {
                  if (uVar4 != 3 || qVar1 < 9) {
                    pcVar6 = "InitNodes: hub board has Firmware Rev ";
                    if (uVar4 != 3) {
                      pcVar6 = "InitNodes: hub board is FPGA V";
                    }
                    poVar5 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,pcVar6)
                    ;
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                  }
                  poVar5 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                                           ", using Ethernet/Firewire bridge");
                  std::endl<char,std::char_traits<char>>(poVar5);
                  (this->super_EthBasePort).useFwBridge = true;
                  return 0x10;
                }
                poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
                pcVar6 = "InitNodes: using Ethernet network";
              }
              else {
                poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
                pcVar6 = "InitNodes: using Ethernet/Firewire bridge";
              }
              poVar5 = std::operator<<(poVar5,pcVar6);
              std::endl<char,std::char_traits<char>>(poVar5);
              return 0x10;
            }
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar6 = "InitNodes: failed to read Ethernet status from hub/bridge board";
          }
        }
      }
    }
  }
  poVar5 = std::operator<<(poVar5,pcVar6);
LAB_00112ac8:
  std::endl<char,std::char_traits<char>>(poVar5);
  return 0;
}

Assistant:

nodeid_t EthUdpPort::InitNodes(void)
{
    // First, set IP address by Ethernet and FireWire broadcast
    // For Firmware Rev 9+, this also causes the FPGA to send a raw Ethernet multicast quadlet write packet
    // so that the port forwarding database in the FPGA V3 Ethernet Switch gets updated
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::IP_ADDR, sockPtr->ServerAddr.sin_addr.s_addr, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to write IP address" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.2);

    quadlet_t data = 0;

    // Check hardware version of hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::HARDWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read hardware version for hub/bridge board" << std::endl;
        return 0;
    }
    if (!HardwareVersionValid(data)) {
        outStr << "InitNodes: hub board is not a supported board, data = " << std::hex << data << std::endl;
        return 0;
    }

    // ReadQuadletNode should have updated bus generation
    FwBusGeneration = newFwBusGeneration;
    outStr << "InitNodes: Firewire bus generation = " << FwBusGeneration << std::endl;

    // Broadcast a command to initiate a read of Firewire PHY Register 0. In cases where there is no
    // Firewire bus master (i.e., only FPGA/QLA boards on the Firewire bus), this allows each board
    // to obtain its Firewire node id.
    data = 0;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to broadcast PHY command" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.01);

    // Find board id for first board (i.e., one connected by Ethernet) by FireWire and Ethernet broadcast
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::BOARD_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read board id for hub/bridge board" << std::endl;
        return 0;
    }
    // board_id is bits 27-24, BOARD_ID_MASK = 0x0f000000
    HubBoard = (data & BOARD_ID_MASK) >> 24;
    outStr << "InitNodes: found hub board: " << static_cast<int>(HubBoard) << std::endl;

    // read firmware version
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::FIRMWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: unable to read firmware version from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fver = data;
    FirmwareVersion[HubBoard] = data;

    // Get FPGA version of Hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::ETH_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read Ethernet status from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
    FpgaVersion[HubBoard] = fpga_ver;

    if (!useFwBridge && ((fpga_ver != 3) || (fver < 9))) {
        if (fpga_ver != 3)
            outStr << "InitNodes: hub board is FPGA V" << fpga_ver;
        else if (fver < 9)
            outStr << "InitNodes: hub board has Firmware Rev " << fver;
        outStr << ", using Ethernet/Firewire bridge" << std::endl;
        useFwBridge = true;
    }
    else if (useFwBridge)
        outStr << "InitNodes: using Ethernet/Firewire bridge" << std::endl;
    else
        outStr << "InitNodes: using Ethernet network" << std::endl;

    // Scan for up to 16 nodes on bus
    return BoardIO::MAX_BOARDS;
}